

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar16 = pGVar7->Count;
  dVar1 = pGVar7->XScale;
  dVar2 = pGVar7->X0;
  dVar12 = log10((double)*(uint *)((long)pGVar7->Ys +
                                  (long)(((prim + 1 + pGVar7->Offset) % iVar16 + iVar16) % iVar16) *
                                  (long)pGVar7->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar16 = pTVar8->YAxis;
  pIVar9 = pIVar15->CurrentPlot;
  dVar3 = pIVar9->YAxis[iVar16].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar16].Min;
  fVar17 = (float)(pIVar15->Mx * ((dVar2 + (double)(prim + 1) * dVar1) - (pIVar9->XAxis).Range.Min)
                  + (double)IVar4.x);
  fVar18 = (float)(pIVar15->My[iVar16] *
                   ((dVar3 + (double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                             (pIVar9->YAxis[iVar16].Range.Max - dVar3)) - dVar3) + (double)IVar4.y);
  fVar19 = (this->P1).x;
  fVar20 = (this->P1).y;
  auVar22._0_4_ = ~-(uint)(fVar17 <= fVar19) & (uint)fVar17;
  auVar22._4_4_ = ~-(uint)(fVar18 <= fVar20) & (uint)fVar18;
  auVar22._8_4_ = ~-(uint)(fVar19 < fVar17) & (uint)fVar17;
  auVar22._12_4_ = ~-(uint)(fVar20 < fVar18) & (uint)fVar18;
  auVar13._4_4_ = (uint)fVar20 & -(uint)(fVar18 <= fVar20);
  auVar13._0_4_ = (uint)fVar19 & -(uint)(fVar17 <= fVar19);
  auVar13._8_4_ = (uint)fVar19 & -(uint)(fVar19 < fVar17);
  auVar13._12_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar18);
  auVar22 = auVar22 | auVar13;
  fVar21 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar22._8_8_;
  auVar14._0_4_ = -(uint)(auVar22._4_4_ < fVar21);
  auVar23._0_8_ = auVar14._0_8_ << 0x20;
  auVar23._8_4_ = -(uint)(auVar22._8_4_ < (cull_rect->Max).x);
  auVar23._12_4_ = -(uint)(auVar22._12_4_ < (cull_rect->Max).y);
  auVar24._4_4_ = -(uint)(fVar21 < auVar22._4_4_);
  auVar24._0_4_ = -(uint)((cull_rect->Min).x < auVar22._0_4_);
  auVar24._8_8_ = auVar23._8_8_;
  iVar16 = movmskps((int)pIVar9,auVar24);
  if (iVar16 == 0xf) {
    fVar21 = fVar20 + this->HalfWeight;
    fVar20 = fVar20 - this->HalfWeight;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar19;
    (pIVar10->pos).y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar17;
    pIVar10[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar19;
    pIVar10[2].pos.y = fVar20;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar17;
    pIVar10[3].pos.y = fVar21;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar6;
    puVar11[1] = uVar6 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar6;
    puVar11[4] = uVar6 + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar20 = fVar17 - this->HalfWeight;
    fVar19 = this->HalfWeight + fVar17;
    fVar21 = (this->P1).y;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar20;
    pIVar10[4].pos.y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar19;
    pIVar10[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar20;
    pIVar10[2].pos.y = fVar21;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar19;
    pIVar10[3].pos.y = fVar18;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar6;
    puVar11[1] = uVar6 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar6;
    puVar11[4] = uVar6 + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar4.y = fVar18;
  IVar4.x = fVar17;
  this->P1 = IVar4;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }